

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_fragmentation.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    tlv_value_buffer[lVar2] = (uint8_t)lVar2;
  }
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&small_if);
  rfc5444_writer_register_target(&writer,&large_if);
  lVar2 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar2 + 0xd8) = addMessageHeader;
  *(code **)(lVar2 + 0xe0) = finishMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,1);
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_frag_80_1");
  tlvcount = 1;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_80_1",0xaa,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 1,"test_frag_80_1",0xae,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 1,"test_frag_80_1",0xaf,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_1",0xb0,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_1");
  cunit_start_test("test_frag_80_2");
  tlvcount = 2;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_80_2",0xbc,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_80_2",0xc0,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_80_2",0xc1,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_2",0xc2,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_2");
  cunit_start_test("test_frag_80_3");
  iVar3 = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  tlvcount = iVar3;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_80_3",0xce,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 3,"test_frag_80_3",0xd2,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 3,"test_frag_80_3",0xd3,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 2,"test_frag_80_3",0xd4,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_3");
  cunit_start_test("test_frag_50_3");
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x32;
  tlvcount = iVar3;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_50_3",0xe0,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_50_3",0xe4,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_50_3",0xe5,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_50_3",0xe6,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_50_3");
  cunit_start_test("test_frag_150_3");
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x96;
  tlvcount = iVar3;
  iVar1 = rfc5444_writer_create_message(&writer,4,1,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 != 0,"test_frag_150_3",0xf2,"Parser should return -1");
  cunit_named_check(fragments == 0,"test_frag_150_3",0xf4,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 0,"test_frag_150_3",0xf5,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 0,"test_frag_150_3",0xf6,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_150_3");
  rfc5444_writer_cleanup(&writer);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;
  size_t i;

  for (i=0; i<sizeof(tlv_value_buffer); i++) {
    tlv_value_buffer[i] = i;
  }

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &small_if);
  rfc5444_writer_register_target(&writer, &large_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;
  msg->finishMessageHeader = finishMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test_frag_80_1();
  test_frag_80_2();
  test_frag_80_3();
  test_frag_50_3();
  test_frag_150_3();

  rfc5444_writer_cleanup(&writer);

  return FINISH_TESTING();
}